

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

bool __thiscall
cmDependsFortran::WriteDependencies
          (cmDependsFortran *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sources,string *obj,ostream *param_3,ostream *param_4)

{
  _Rb_tree_node_base *src;
  bool bVar1;
  int iVar2;
  cmFortranSourceInfo *info;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  cmFortranCompiler fc;
  cmFortranParser parser;
  undefined1 local_2e0 [32];
  _Alloc_hider local_2c0;
  size_type local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  _Alloc_hider local_2a0;
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_280;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  undefined1 local_238 [424];
  cmFortranCompiler local_90;
  
  if (((sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) ||
     ((sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent == (_Base_ptr)0x0
     )) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_238,"Cannot scan dependencies without a source file.",
               (allocator<char> *)local_2e0);
    cmSystemTools::Error((string *)local_238);
  }
  else {
    if (obj->_M_string_length != 0) {
      local_2e0._0_8_ = local_2e0 + 0x10;
      local_2e0._8_8_ = 0;
      local_2e0[0x10] = '\0';
      local_2c0._M_p = (pointer)&local_2b0;
      local_2b8 = 0;
      local_2b0._M_local_buf[0] = '\0';
      local_2a0._M_p = (pointer)&local_290;
      local_298 = 0;
      local_290._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_assign((string *)local_2e0);
      std::__cxx11::string::_M_assign((string *)&local_2c0);
      std::__cxx11::string::_M_assign((string *)&local_2a0);
      bVar1 = true;
      for (p_Var4 = (sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(sources->_M_t)._M_impl.super__Rb_tree_header;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        src = p_Var4 + 1;
        info = cmDependsFortranInternals::CreateObjectInfo
                         ((this->Internal)._M_t.
                          super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
                          .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl,
                          obj,(string *)src);
        cmFortranCompiler::cmFortranCompiler(&local_90,(cmFortranCompiler *)local_2e0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_280,&(this->super_cmDepends).IncludePath);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_Rb_tree(&local_268,&(this->PPDefinitions)._M_t);
        cmFortranParser_s::cmFortranParser_s
                  ((cmFortranParser_s *)local_238,&local_90,&local_280,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_268,info);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_268);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_280);
        cmFortranCompiler::~cmFortranCompiler(&local_90);
        cmFortranParser_FilePush((cmFortranParser_s *)local_238,*(char **)src);
        iVar2 = cmFortran_yyparse((yyscan_t)local_238._120_8_);
        if (iVar2 != 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "warning: failed to parse dependencies from Fortran source \'");
          poVar3 = std::operator<<(poVar3,(string *)src);
          poVar3 = std::operator<<(poVar3,"\': ");
          poVar3 = std::operator<<(poVar3,(string *)(local_238 + 0xf0));
          std::endl<char,std::char_traits<char>>(poVar3);
          bVar1 = false;
        }
        cmFortranParser_s::~cmFortranParser_s((cmFortranParser_s *)local_238);
      }
      cmFortranCompiler::~cmFortranCompiler((cmFortranCompiler *)local_2e0);
      return bVar1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_238,"Cannot scan dependencies without an object file.",
               (allocator<char> *)local_2e0);
    cmSystemTools::Error((string *)local_238);
  }
  std::__cxx11::string::~string((string *)local_238);
  return false;
}

Assistant:

bool cmDependsFortran::WriteDependencies(const std::set<std::string>& sources,
                                         const std::string& obj,
                                         std::ostream& /*makeDepends*/,
                                         std::ostream& /*internalDepends*/)
{
  // Make sure this is a scanning instance.
  if (sources.empty() || sources.begin()->empty()) {
    cmSystemTools::Error("Cannot scan dependencies without a source file.");
    return false;
  }
  if (obj.empty()) {
    cmSystemTools::Error("Cannot scan dependencies without an object file.");
    return false;
  }

  cmFortranCompiler fc;
  fc.Id = this->CompilerId;
  fc.SModSep = this->SModSep;
  fc.SModExt = this->SModExt;

  bool okay = true;
  for (std::string const& src : sources) {
    // Get the information object for this source.
    cmFortranSourceInfo& info = this->Internal->CreateObjectInfo(obj, src);

    // Create the parser object. The constructor takes info by reference,
    // so we may look into the resulting objects later.
    cmFortranParser parser(fc, this->IncludePath, this->PPDefinitions, info);

    // Push on the starting file.
    cmFortranParser_FilePush(&parser, src.c_str());

    // Parse the translation unit.
    if (cmFortran_yyparse(parser.Scanner) != 0) {
      // Failed to parse the file.  Report failure to write dependencies.
      okay = false;
      /* clang-format off */
      std::cerr <<
        "warning: failed to parse dependencies from Fortran source "
        "'" << src << "': " << parser.Error << std::endl
        ;
      /* clang-format on */
    }
  }
  return okay;
}